

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::GetLocalHostName
          (RTPUDPv4Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  reference pbVar6;
  long lVar7;
  size_t sVar8;
  void *__src;
  reference puVar9;
  size_t sVar10;
  RTPMemoryManager *pRVar11;
  uint8_t *puVar12;
  bool bVar13;
  bool local_1fa;
  bool local_1f9;
  bool local_1e1;
  iterator local_1b8;
  _List_const_iterator<unsigned_int> local_1b0;
  char local_1a8 [8];
  char str [16];
  int len;
  uint32_t ip_1;
  iterator local_180;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  iterator local_170;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  const_iterator it_2;
  bool found;
  iterator local_140;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  iterator local_130;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  allocator<char> local_119;
  undefined1 local_118 [8];
  string hname_1;
  int i;
  iterator local_e8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  iterator local_d8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  const_iterator it_1;
  undefined1 local_b8 [8];
  string hname;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  uint32_t ip;
  uint8_t addr [4];
  hostent *he;
  bool foundentry;
  iterator iStack_70;
  bool founddouble;
  _List_const_iterator<unsigned_int> local_68;
  iterator local_60;
  _List_const_iterator<unsigned_int> local_58;
  undefined1 local_50 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  const_iterator it;
  size_t *bufferlength_local;
  uint8_t *buffer_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    return -0x5a;
  }
  if ((this->created & 1U) == 0) {
    return -0x59;
  }
  if (this->localhostname != (uint8_t *)0x0) goto LAB_00151506;
  bVar4 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->localIPs);
  if (bVar4) {
    return -0x55;
  }
  std::_List_const_iterator<unsigned_int>::_List_const_iterator
            ((_List_const_iterator<unsigned_int> *)
             &hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_50);
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->localIPs);
  std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_58,&local_60);
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)local_58._M_node;
  while( true ) {
    iStack_70 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                          (&this->localIPs);
    std::_List_const_iterator<unsigned_int>::_List_const_iterator
              (&local_68,&stack0xffffffffffffff90);
    bVar4 = std::operator!=((_Self *)&hostnames.
                                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl._M_node._M_size,&local_68);
    if (!bVar4) break;
    bVar4 = false;
    bVar3 = true;
    while( true ) {
      bVar13 = false;
      if (!bVar4) {
        bVar13 = bVar3;
      }
      if (!bVar13) break;
      puVar9 = std::_List_const_iterator<unsigned_int>::operator*
                         ((_List_const_iterator<unsigned_int> *)
                          &hostnames.
                           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl._M_node._M_size);
      uVar1 = *puVar9;
      uStack_85 = (undefined1)(uVar1 >> 0x18);
      local_84 = uStack_85;
      uStack_86 = (undefined1)(uVar1 >> 0x10);
      local_83 = uStack_86;
      uStack_87 = (undefined1)(uVar1 >> 8);
      local_82 = uStack_87;
      local_88 = (undefined1)uVar1;
      local_81 = local_88;
      _ip = gethostbyaddr(&local_84,4,2);
      if (_ip == (hostent *)0x0) {
        bVar3 = false;
      }
      else {
        pcVar2 = _ip->h_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,pcVar2,(allocator<char> *)((long)&it_1._M_node + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_c8);
        local_d8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_d0,&local_d8);
        local_c8._M_node = local_d0._M_node;
        while( true ) {
          local_1e1 = false;
          if (!bVar4) {
            local_e8._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
            std::
            _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_List_const_iterator(&local_e0,&local_e8);
            local_1e1 = std::operator!=(&local_c8,&local_e0);
          }
          if (local_1e1 == false) break;
          pbVar6 = std::
                   _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c8);
          _Var5 = std::operator==(pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b8);
          if (_Var5) {
            bVar4 = true;
          }
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_c8,0);
        }
        if (!bVar4) {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_50,(value_type *)local_b8);
        }
        hname_1.field_2._12_4_ = 0;
        while( true ) {
          bVar13 = false;
          if (!bVar4) {
            bVar13 = _ip->h_aliases[(int)hname_1.field_2._12_4_] != (char *)0x0;
          }
          if (!bVar13) break;
          pcVar2 = _ip->h_aliases[(int)hname_1.field_2._12_4_];
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_118,pcVar2,&local_119);
          std::allocator<char>::~allocator(&local_119);
          local_130._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_List_const_iterator(&local_128,&local_130);
          local_c8._M_node = local_128._M_node;
          while( true ) {
            local_1f9 = false;
            if (!bVar4) {
              local_140._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_50);
              std::
              _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_List_const_iterator(&local_138,&local_140);
              local_1f9 = std::operator!=(&local_c8,&local_138);
            }
            if (local_1f9 == false) break;
            pbVar6 = std::
                     _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_c8);
            _Var5 = std::operator==(pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_118);
            if (_Var5) {
              bVar4 = true;
            }
            std::
            _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_c8,0);
          }
          if (!bVar4) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_50,(value_type *)local_118);
            hname_1.field_2._12_4_ = hname_1.field_2._12_4_ + 1;
          }
          std::__cxx11::string::~string((string *)local_118);
        }
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
    std::_List_const_iterator<unsigned_int>::operator++
              ((_List_const_iterator<unsigned_int> *)
               &hostnames.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size,0);
  }
  it_2._M_node._7_1_ = 0;
  bVar4 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50);
  if (!bVar4) {
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_160);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sort((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
    local_170._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_168,&local_170);
    local_160._M_node = local_168._M_node;
    while( true ) {
      local_1fa = false;
      if ((it_2._M_node._7_1_ & 1) == 0) {
        local_180._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_178,&local_180);
        local_1fa = std::operator!=(&local_160,&local_178);
      }
      if (local_1fa == false) break;
      pbVar6 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_160);
      lVar7 = std::__cxx11::string::find((char)pbVar6,0x2e);
      if (lVar7 != -1) {
        it_2._M_node._7_1_ = 1;
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_160);
        sVar8 = std::__cxx11::string::length();
        this->localhostnamelength = sVar8;
        sVar8 = this->localhostnamelength;
        pRVar11 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        puVar12 = (uint8_t *)operator_new__(sVar8 + 1,pRVar11,0);
        this->localhostname = puVar12;
        if (this->localhostname == (uint8_t *)0x0) {
          this_local._4_4_ = -1;
          bVar4 = true;
          goto LAB_001514e2;
        }
        puVar12 = this->localhostname;
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_160);
        __src = (void *)std::__cxx11::string::c_str();
        memcpy(puVar12,__src,this->localhostnamelength);
        this->localhostname[this->localhostnamelength] = '\0';
      }
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_160,0);
    }
  }
  if ((it_2._M_node._7_1_ & 1) == 0) {
    local_1b8._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->localIPs);
    std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_1b0,&local_1b8);
    hostnames.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = (size_t)local_1b0._M_node;
    puVar9 = std::_List_const_iterator<unsigned_int>::operator*
                       ((_List_const_iterator<unsigned_int> *)
                        &hostnames.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size);
    str._12_4_ = *puVar9;
    snprintf(local_1a8,0x10,"%d.%d.%d.%d",(ulong)((uint)str._12_4_ >> 0x18),
             (ulong)((uint)str._12_4_ >> 0x10 & 0xff),(ulong)(byte)((uint)str._12_4_ >> 8),
             str._12_4_ & 0xff);
    sVar10 = strlen(local_1a8);
    str._8_4_ = (undefined4)sVar10;
    this->localhostnamelength = (long)(int)str._8_4_;
    sVar8 = this->localhostnamelength;
    pRVar11 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    puVar12 = (uint8_t *)operator_new__(sVar8 + 1,pRVar11,0);
    this->localhostname = puVar12;
    if (this->localhostname != (uint8_t *)0x0) {
      memcpy(this->localhostname,local_1a8,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
      goto LAB_001514d8;
    }
    this_local._4_4_ = -1;
    bVar4 = true;
  }
  else {
LAB_001514d8:
    bVar4 = false;
  }
LAB_001514e2:
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_50);
  if (bVar4) {
    return this_local._4_4_;
  }
LAB_00151506:
  if (*bufferlength < this->localhostnamelength) {
    *bufferlength = this->localhostnamelength;
    this_local._4_4_ = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,this->localhostnamelength);
    *bufferlength = this->localhostnamelength;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				uint8_t addr[4];
				uint32_t ip = (*it);
		
				addr[0] = (uint8_t)((ip>>24)&0xFF);
				addr[1] = (uint8_t)((ip>>16)&0xFF);
				addr[2] = (uint8_t)((ip>>8)&0xFF);
				addr[3] = (uint8_t)(ip&0xFF);
				he = gethostbyaddr((char *)addr,4,AF_INET);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);
					
					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
					
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
		
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			RTP_SNPRINTF(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}